

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chainparamsbase.cpp
# Opt level: O1

void SelectBaseParams(ChainType chain)

{
  unique_ptr<CBaseChainParams,_std::default_delete<CBaseChainParams>_> __ptr_00;
  _Alloc_hider _Var1;
  pointer *__ptr;
  long in_FS_OFFSET;
  string local_38;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  CreateBaseChainParams((ChainType)&local_38);
  _Var1._M_p = local_38._M_dataplus._M_p;
  __ptr_00 = globalChainBaseParams;
  local_38._M_dataplus._M_p = (pointer)0x0;
  globalChainBaseParams._M_t.
  super___uniq_ptr_impl<CBaseChainParams,_std::default_delete<CBaseChainParams>_>._M_t.
  super__Tuple_impl<0UL,_CBaseChainParams_*,_std::default_delete<CBaseChainParams>_>.
  super__Head_base<0UL,_CBaseChainParams_*,_false>._M_head_impl =
       (__uniq_ptr_data<CBaseChainParams,_std::default_delete<CBaseChainParams>,_true,_true>)
       (__uniq_ptr_data<CBaseChainParams,_std::default_delete<CBaseChainParams>,_true,_true>)
       _Var1._M_p;
  if ((__uniq_ptr_impl<CBaseChainParams,_std::default_delete<CBaseChainParams>_>)
      __ptr_00._M_t.super___uniq_ptr_impl<CBaseChainParams,_std::default_delete<CBaseChainParams>_>.
      _M_t.super__Tuple_impl<0UL,_CBaseChainParams_*,_std::default_delete<CBaseChainParams>_>.
      super__Head_base<0UL,_CBaseChainParams_*,_false>._M_head_impl !=
      (__uniq_ptr_impl<CBaseChainParams,_std::default_delete<CBaseChainParams>_>)0x0) {
    std::default_delete<CBaseChainParams>::operator()
              ((default_delete<CBaseChainParams> *)&globalChainBaseParams,
               (CBaseChainParams *)
               __ptr_00._M_t.
               super___uniq_ptr_impl<CBaseChainParams,_std::default_delete<CBaseChainParams>_>._M_t.
               super__Tuple_impl<0UL,_CBaseChainParams_*,_std::default_delete<CBaseChainParams>_>.
               super__Head_base<0UL,_CBaseChainParams_*,_false>._M_head_impl);
  }
  if ((CBaseChainParams *)local_38._M_dataplus._M_p != (CBaseChainParams *)0x0) {
    std::default_delete<CBaseChainParams>::operator()
              ((default_delete<CBaseChainParams> *)&local_38,
               (CBaseChainParams *)local_38._M_dataplus._M_p);
  }
  ChainTypeToString_abi_cxx11_(&local_38,chain);
  ArgsManager::SelectConfigNetwork(&gArgs,&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void SelectBaseParams(const ChainType chain)
{
    globalChainBaseParams = CreateBaseChainParams(chain);
    gArgs.SelectConfigNetwork(ChainTypeToString(chain));
}